

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bluetooth_packet.c
# Opt level: O0

int decode_payload_header(char *stream,int clock,int header_bytes,int size,int fec,btbb_packet *pkt)

{
  byte bVar1;
  uint8_t uVar2;
  uint16_t uVar3;
  char *pcVar4;
  int local_54;
  int local_44;
  int max_length;
  char *corrected_1;
  char *corrected;
  btbb_packet *pkt_local;
  int fec_local;
  int size_local;
  int header_bytes_local;
  int clock_local;
  char *stream_local;
  
  if (header_bytes == 2) {
    if (size < 0x10) {
      return 0;
    }
    if (fec == 0) {
      unwhiten(stream,pkt->payload_header,clock,0x10,0x12,pkt);
    }
    else {
      if (size < 0x1e) {
        return 0;
      }
      pcVar4 = unfec23(stream,0x10);
      if (pcVar4 == (char *)0x0) {
        return 0;
      }
      unwhiten(pcVar4,pkt->payload_header,clock,0x10,0x12,pkt);
      free(pcVar4);
    }
    uVar3 = air_to_host16(pkt->payload_header + 3,10);
    pkt->payload_length = uVar3 + 4;
  }
  else {
    if (size < 8) {
      return 0;
    }
    if (fec == 0) {
      unwhiten(stream,pkt->payload_header,clock,8,0x12,pkt);
    }
    else {
      if (size < 0xf) {
        return 0;
      }
      pcVar4 = unfec23(stream,8);
      if (pcVar4 == (char *)0x0) {
        return 0;
      }
      unwhiten(pcVar4,pkt->payload_header,clock,8,0x12,pkt);
      free(pcVar4);
    }
    bVar1 = air_to_host8(pkt->payload_header + 3,5);
    pkt->payload_length = bVar1 + 3;
  }
  local_44 = 0;
  switch(pkt->packet_type) {
  case '\x03':
    local_44 = 0x14;
    break;
  case '\x04':
    local_44 = 0x1e;
    break;
  case '\b':
    local_44 = 0xc;
    break;
  case '\n':
    local_44 = 0x7d;
    break;
  case '\v':
    local_44 = 0xbb;
    break;
  case '\x0e':
    local_44 = 0xe4;
    break;
  case '\x0f':
    local_44 = 0x157;
  }
  if (pkt->payload_length < local_44) {
    local_54 = pkt->payload_length;
  }
  else {
    local_54 = local_44;
  }
  pkt->payload_length = local_54;
  uVar2 = air_to_host8(pkt->payload_header,2);
  pkt->payload_llid = uVar2;
  uVar2 = air_to_host8(pkt->payload_header + 2,1);
  pkt->payload_flow = uVar2;
  pkt->payload_header_length = header_bytes;
  return 1;
}

Assistant:

static int decode_payload_header(char *stream, int clock, int header_bytes, int size, int fec, btbb_packet* pkt)
{
	if(header_bytes == 2)
	{
		if(size < 16)
			return 0; //FIXME should throw exception
		if(fec) {
			if(size < 30)
				return 0; //FIXME should throw exception
			char *corrected = unfec23(stream, 16);
			if (!corrected)
				return 0;
			unwhiten(corrected, pkt->payload_header, clock, 16, 18, pkt);
			free(corrected);
		} else {
			unwhiten(stream, pkt->payload_header, clock, 16, 18, pkt);
		}
		/* payload length is payload body length + 2 bytes payload header + 2 bytes CRC */
		pkt->payload_length = air_to_host16(&pkt->payload_header[3], 10) + 4;
	} else {
		if(size < 8)
			return 0; //FIXME should throw exception
		if(fec) {
			if(size < 15)
				return 0; //FIXME should throw exception
			char *corrected = unfec23(stream, 8);
			if (!corrected)
				return 0;
			unwhiten(corrected, pkt->payload_header, clock, 8, 18, pkt);
			free(corrected);
		} else {
			unwhiten(stream, pkt->payload_header, clock, 8, 18, pkt);
		}
		/* payload length is payload body length + 1 byte payload header + 2 bytes CRC */
		pkt->payload_length = air_to_host8(&pkt->payload_header[3], 5) + 3;
	}
	/* Try to set the max payload length to a sensible value,
	 * especially when using strange data
	 */
	int max_length = 0;
	switch(pkt->packet_type) {
		case PACKET_TYPE_DM1:
			max_length = 20;
			break;
		case PACKET_TYPE_DH1:
			/* assuming DH1 but could be 2-DH1 (58) */
			max_length = 30;
			break;
		case PACKET_TYPE_DV:
			/* assuming DV but could be 3-DH1 (87) */
			max_length = 12; /* + 10bytes of voice data */
			break;
		case PACKET_TYPE_DM3:
			/* assuming DM3 but could be 2-DH3 (371) */
			max_length = 125;
			break;
		case PACKET_TYPE_DH3:
			/* assuming DH3 but could be 3-DH3 (556) */
			max_length = 187;
			break;
		case PACKET_TYPE_DM5:
			/* assuming DM5 but could be 2-DH5 (683) */
			max_length = 228;
			break;
		case PACKET_TYPE_DH5:
			/* assuming DH5 but could be 3-DH5 (1025) */
			max_length = 343;
			break;
	}
	pkt->payload_length = MIN(pkt->payload_length, max_length);
	pkt->payload_llid = air_to_host8(&pkt->payload_header[0], 2);
	pkt->payload_flow = air_to_host8(&pkt->payload_header[2], 1);
	pkt->payload_header_length = header_bytes;
	return 1;
}